

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

EffectiveSign __thiscall
anon_unknown.dwarf_d910b3::EffectiveSignVisitor::visit<slang::ast::UnaryExpression>
          (EffectiveSignVisitor *this,UnaryExpression *expr)

{
  bool bVar1;
  UnaryExpression *in_RSI;
  Expression *in_RDI;
  undefined4 local_4;
  
  bVar1 = slang::ast::Expression::bad(in_RDI);
  if (bVar1) {
    local_4 = Either;
  }
  else {
    local_4 = slang::ast::UnaryExpression::getEffectiveSignImpl
                        (in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  }
  return local_4;
}

Assistant:

EffectiveSign visit(const T& expr) {
        if constexpr (requires { expr.getEffectiveSignImpl(isForConversion); }) {
            if (expr.bad())
                return EffectiveSign::Either;

            return expr.getEffectiveSignImpl(isForConversion);
        }
        else {
            return expr.type->isSigned() ? EffectiveSign::Signed : EffectiveSign::Unsigned;
        }
    }